

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.cpp
# Opt level: O0

void __thiscall Liby::TimerQueue::TimerQueue(TimerQueue *this,Poller *poller)

{
  int iVar1;
  Logger *pLVar2;
  int *piVar3;
  double __x;
  double __x_00;
  unique_ptr<Liby::Channel,_std::default_delete<Liby::Channel>_> local_40;
  shared_ptr<Liby::FileDescriptor> local_38 [2];
  Poller *local_18;
  Poller *poller_local;
  TimerQueue *this_local;
  
  local_18 = poller;
  poller_local = (Poller *)this;
  std::shared_ptr<Liby::FileDescriptor>::shared_ptr(&this->timerfp_);
  std::unique_ptr<Liby::Channel,std::default_delete<Liby::Channel>>::
  unique_ptr<std::default_delete<Liby::Channel>,void>
            ((unique_ptr<Liby::Channel,std::default_delete<Liby::Channel>> *)&this->timerChan_);
  this->poller_ = local_18;
  BinaryHeap<Liby::WeakTimerHolder>::BinaryHeap(&this->queue_,100);
  if (this->poller_ == (Poller *)0x0) {
    pLVar2 = Logger::getLogger();
    Logger::log(pLVar2,__x);
    exit(1);
  }
  iVar1 = timerfd_create(0,0x80800);
  this->timerfd_ = iVar1;
  if (this->timerfd_ < 0) {
    pLVar2 = Logger::getLogger();
    piVar3 = __errno_location();
    strerror(*piVar3);
    Logger::log(pLVar2,__x_00);
    exit(1);
  }
  std::make_shared<Liby::FileDescriptor,int&>((int *)local_38);
  std::shared_ptr<Liby::FileDescriptor>::operator=(&this->timerfp_,local_38);
  std::shared_ptr<Liby::FileDescriptor>::~shared_ptr(local_38);
  std::make_unique<Liby::Channel,Liby::Poller*&,int&>((Poller **)&local_40,(int *)&this->poller_);
  std::unique_ptr<Liby::Channel,_std::default_delete<Liby::Channel>_>::operator=
            (&this->timerChan_,&local_40);
  std::unique_ptr<Liby::Channel,_std::default_delete<Liby::Channel>_>::~unique_ptr(&local_40);
  return;
}

Assistant:

TimerQueue::TimerQueue(Poller *poller) : poller_(poller) {
#ifdef __linux__
    fatalif(poller_ == nullptr, "Poller cannot be nullptr");
    timerfd_ = ::timerfd_create(CLOCK_REALTIME, TFD_CLOEXEC | TFD_NONBLOCK);
    fatalif(timerfd_ < 0, "timerfd_create: %s", ::strerror(errno));
    timerfp_ = std::make_shared<FileDescriptor>(timerfd_);
    timerChan_ = std::make_unique<Channel>(poller_, timerfd_);
#endif
}